

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O0

char * Varint::Parse64WithLimit(char *p,char *l,uint64 *OUTPUT)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong local_48;
  uint64 result;
  uint64 b;
  uchar *limit;
  uchar *ptr;
  uint64 *OUTPUT_local;
  char *l_local;
  char *p_local;
  
  if (l < p + 10) {
    if (p < l) {
      limit = (uchar *)(p + 1);
      local_48 = (ulong)(byte)*p;
      if (0x7f < local_48) {
        if (l <= limit) {
          return (char *)0x0;
        }
        pbVar2 = (byte *)(p + 2);
        bVar1 = *limit;
        local_48 = ((ulong)bVar1 - 1) * 0x80 + local_48;
        limit = pbVar2;
        if (0x7f < (ulong)bVar1) {
          if (l <= pbVar2) {
            return (char *)0x0;
          }
          pbVar3 = (byte *)(p + 3);
          local_48 = ((ulong)*pbVar2 - 1) * 0x4000 + local_48;
          limit = pbVar3;
          if (0x7f < (ulong)*pbVar2) {
            if (l <= pbVar3) {
              return (char *)0x0;
            }
            pbVar2 = (byte *)(p + 4);
            local_48 = ((ulong)*pbVar3 - 1) * 0x200000 + local_48;
            limit = pbVar2;
            if (0x7f < (ulong)*pbVar3) {
              if (l <= pbVar2) {
                return (char *)0x0;
              }
              pbVar3 = (byte *)(p + 5);
              local_48 = ((ulong)*pbVar2 - 1) * 0x10000000 + local_48;
              limit = pbVar3;
              if (0x7f < (ulong)*pbVar2) {
                if (l <= pbVar3) {
                  return (char *)0x0;
                }
                pbVar2 = (byte *)(p + 6);
                local_48 = ((ulong)*pbVar3 - 1 << 0x23) + local_48;
                limit = pbVar2;
                if (0x7f < (ulong)*pbVar3) {
                  if (l <= pbVar2) {
                    return (char *)0x0;
                  }
                  pbVar3 = (byte *)(p + 7);
                  local_48 = ((ulong)*pbVar2 - 1 << 0x2a) + local_48;
                  limit = pbVar3;
                  if (0x7f < (ulong)*pbVar2) {
                    if (l <= pbVar3) {
                      return (char *)0x0;
                    }
                    pbVar2 = (byte *)(p + 8);
                    local_48 = ((ulong)*pbVar3 - 1 << 0x31) + local_48;
                    limit = pbVar2;
                    if (0x7f < (ulong)*pbVar3) {
                      if (l <= pbVar2) {
                        return (char *)0x0;
                      }
                      pbVar3 = (byte *)(p + 9);
                      local_48 = ((ulong)(byte)(*pbVar2 - 1) << 0x38) + local_48;
                      limit = pbVar3;
                      if (0x7f < *pbVar2) {
                        if (l <= pbVar3) {
                          return (char *)0x0;
                        }
                        local_48 = ((ulong)*pbVar3 - 1 << 0x3f) + local_48;
                        limit = (uchar *)(p + 10);
                        if (1 < (ulong)*pbVar3) {
                          return (char *)0x0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      *OUTPUT = local_48;
      p_local = (char *)limit;
    }
    else {
      p_local = (char *)0x0;
    }
  }
  else {
    p_local = Parse64(p,OUTPUT);
  }
  return p_local;
}

Assistant:

const char* Varint::Parse64WithLimit(const char* p,
                                     const char* l,
                                     uint64* OUTPUT) {
  if (p + kMax64 <= l) {
    return Parse64(p, OUTPUT);
  } else {
    // See detailed comment in Varint::Parse64Fallback about this general
    // approach.
    const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
    const unsigned char* limit = reinterpret_cast<const unsigned char*>(l);
    uint64 b, result;
#if defined(__x86_64__)
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result = b;              if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) <<  7; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 14; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 21; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 28; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 35; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 42; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 49; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 56; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result += (b - 1) << 63; if (b < 2) goto done;
    return nullptr;       // Value is too long to be a varint64
#else
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result = b & 127;          if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) <<  7; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 14; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 21; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 28; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 35; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 42; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 49; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 56; if (b < 128) goto done;
    if (ptr >= limit) return nullptr;
    b = *(ptr++); result |= (b & 127) << 63; if (b < 2) goto done;
    return nullptr;       // Value is too long to be a varint64
#endif
   done:
    *OUTPUT = result;
    return reinterpret_cast<const char*>(ptr);
  }
}